

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall wabt::interp::Thread::DoCall(Thread *this,Ptr *func,Ptr *out_trap)

{
  ObjectKind OVar1;
  DefinedFunc *func_00;
  RunResult RVar2;
  RunResult RVar3;
  int iVar4;
  Values params;
  Values results;
  allocator_type local_59;
  Values local_58;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_40;
  
  func_00 = (DefinedFunc *)func->obj_;
  OVar1 = (func_00->super_Func).super_Extern.super_Object.kind_;
  if (func_00 == (DefinedFunc *)0x0 || OVar1 != HostFunc) {
    if (OVar1 != DefinedFunc) {
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                    ,0x4e,
                    "Derived *wabt::cast(Base *) [Derived = wabt::interp::DefinedFunc, Base = wabt::interp::Func]"
                   );
    }
    RVar2 = PushCall(this,func_00,out_trap);
    RVar3 = Ok;
    if (RVar2 != Trap) {
      return Ok;
    }
  }
  else {
    local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    PopValues(this,&(func_00->super_Func).type_.params,&local_58);
    RVar3 = PushCall(this,(HostFunc *)func_00,out_trap);
    if (RVar3 == Trap) {
      if (local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      RVar3 = Trap;
    }
    else {
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
                (&local_40,
                 (long)(func_00->super_Func).type_.results.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(func_00->super_Func).type_.results.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3,&local_59);
      iVar4 = (*(func_00->super_Func).super_Extern.super_Object._vptr_Object[5])
                        (func_00,this,&local_58,&local_40,out_trap);
      if (iVar4 != 1) {
        PopCall(this);
        PushValues(this,&(func_00->super_Func).type_.results,&local_40);
      }
      if (local_40.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_40.
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_40.
                              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.
                              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      RVar3 = Trap;
      if (iVar4 != 1) {
        return Ok;
      }
    }
  }
  return RVar3;
}

Assistant:

RunResult Thread::DoCall(const Func::Ptr& func, Trap::Ptr* out_trap) {
  if (auto* host_func = dyn_cast<HostFunc>(func.get())) {
    auto& func_type = host_func->type();

    Values params;
    PopValues(func_type.params, &params);
    if (PushCall(*host_func, out_trap) == RunResult::Trap) {
      return RunResult::Trap;
    }

    Values results(func_type.results.size());
    if (Failed(host_func->Call(*this, params, results, out_trap))) {
      return RunResult::Trap;
    }

    PopCall();
    PushValues(func_type.results, results);
  } else {
    if (PushCall(*cast<DefinedFunc>(func.get()), out_trap) == RunResult::Trap) {
      return RunResult::Ok;
    }
  }
  return RunResult::Ok;
}